

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O2

void trad_enc_update_keys(trad_enc_ctx *ctx,uint8_t c)

{
  uint uVar1;
  uint8_t t;
  uint8_t c_local;
  
  uVar1 = crc32(~ctx->keys[0],&c_local,1);
  ctx->keys[0] = ~uVar1;
  ctx->keys[1] = ((~uVar1 & 0xff) + ctx->keys[1]) * 0x8088405 + 1;
  uVar1 = crc32(~ctx->keys[2],&t,1);
  ctx->keys[2] = ~uVar1;
  return;
}

Assistant:

static void
trad_enc_update_keys(struct trad_enc_ctx *ctx, uint8_t c)
{
	uint8_t t;
#define CRC32(c, b) (crc32(c ^ 0xffffffffUL, &b, 1) ^ 0xffffffffUL)

	ctx->keys[0] = CRC32(ctx->keys[0], c);
	ctx->keys[1] = (ctx->keys[1] + (ctx->keys[0] & 0xff)) * 134775813L + 1;
	t = (ctx->keys[1] >> 24) & 0xff;
	ctx->keys[2] = CRC32(ctx->keys[2], t);
#undef CRC32
}